

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O3

int sigfiddle_setnpoints(t_sigfiddle *x,t_floatarg fnpoints)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  t_float *ptVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  uVar7 = (uint)fnpoints;
  sigfiddle_freebird(x);
  if (uVar7 - 0x2001 < 0xffffe07f) {
    uVar7 = 0x400;
    pd_error((void *)0x0,"fiddle~: npoints out of range; using %d",0x400);
  }
  bVar6 = 0xff;
  uVar3 = uVar7;
  do {
    bVar6 = bVar6 + 1;
    bVar2 = 1 < uVar3;
    uVar3 = (int)uVar3 >> 1;
  } while (bVar2);
  if (uVar7 != 1 << (bVar6 & 0x1f)) {
    bVar6 = 0xff;
    do {
      bVar6 = bVar6 + 1;
      bVar2 = 1 < uVar7;
      uVar7 = (int)uVar7 >> 1;
    } while (bVar2);
    uVar7 = 1 << (bVar6 & 0x1f);
    pd_error((void *)0x0,"fiddle~: npoints not a power of 2; using %d",(ulong)uVar7);
  }
  x->x_hop = (int)uVar7 >> 1;
  ptVar4 = (t_float *)getbytes((long)((int)uVar7 >> 1) << 2);
  x->x_inbuf = ptVar4;
  if (ptVar4 != (t_float *)0x0) {
    ptVar4 = (t_float *)getbytes((long)x->x_hop * 8 + 0x50);
    x->x_lastanalysis = ptVar4;
    if (ptVar4 != (t_float *)0x0) {
      ptVar4 = (t_float *)getbytes((long)x->x_hop << 3);
      x->x_spiral = ptVar4;
      if (ptVar4 != (t_float *)0x0) {
        iVar1 = x->x_hop;
        if (0 < (long)iVar1) {
          memset(x->x_inbuf,0,(long)iVar1 * 4);
        }
        if (-0x14 < (int)uVar7) {
          uVar5 = (ulong)(uVar7 + 0x13);
          if ((int)(uVar7 + 0x13) < 1) {
            uVar5 = 0;
          }
          memset(x->x_lastanalysis,0,uVar5 * 4 + 4);
        }
        if (0 < iVar1) {
          lVar8 = 0;
          do {
            dVar9 = ((double)(int)lVar8 * 3.14159) / (double)(int)uVar7;
            dVar10 = cos(dVar9);
            x->x_spiral[lVar8 * 2] = (float)dVar10;
            dVar9 = sin(dVar9);
            x->x_spiral[lVar8 * 2 + 1] = -(float)dVar9;
            lVar8 = lVar8 + 1;
          } while (lVar8 < x->x_hop);
        }
        x->x_phase = 0;
        return 1;
      }
    }
  }
  sigfiddle_freebird(x);
  return 0;
}

Assistant:

int sigfiddle_setnpoints(t_sigfiddle *x, t_floatarg fnpoints)
{
    int i, npoints = fnpoints;
    sigfiddle_freebird(x);
    if (npoints < MINPOINTS || npoints > MAXPOINTS)
    {
        pd_error(0, "fiddle~: npoints out of range; using %d",
            npoints = DEFAULTPOINTS);
    }
    if (npoints != (1 << sigfiddle_ilog2(npoints)))
    {
        pd_error(0, "fiddle~: npoints not a power of 2; using %d",
            npoints = (1 << sigfiddle_ilog2(npoints)));
    }
    x->x_hop = npoints >> 1;
    if (!(x->x_inbuf = (t_float *)getbytes(sizeof(t_float) * x->x_hop)))
        goto fail;
    if (!(x->x_lastanalysis = (t_float *)getbytes(
        sizeof(t_float) * (2 * x->x_hop + 4 * FILTSIZE))))
            goto fail;
    if (!(x->x_spiral = (t_float *)getbytes(sizeof(t_float) * 2 * x->x_hop)))
        goto fail;
    for (i = 0; i < x->x_hop; i++)
        x->x_inbuf[i] = 0;
    for (i = 0; i < npoints + 4 * FILTSIZE; i++)
        x->x_lastanalysis[i] = 0;
    for (i = 0; i < x->x_hop; i++)
        x->x_spiral[2*i] =    cos((3.14159*i)/(npoints)),
        x->x_spiral[2*i+1] = -sin((3.14159*i)/(npoints));
    x->x_phase = 0;
    return (1);
fail:
    sigfiddle_freebird(x);
    return (0);
}